

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O3

void RigidBodyDynamics::NonlinearEffects
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int iVar14;
  pointer pSVar15;
  pointer pSVar16;
  pointer pJVar17;
  pointer ppCVar18;
  pointer pMVar19;
  double *pdVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  ActualDstType actualDst;
  pointer puVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *pvVar52;
  assign_op<double,_double> local_1d1;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *local_1d0;
  VectorNd *local_1c8;
  long local_1c0;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  local_1b8;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  SpatialVector local_188;
  SpatialMatrix local_158;
  
  local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       -(model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[2];
  local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       -(model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[0];
  local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       -(model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[1];
  pSVar15 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  pSVar15 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(undefined8 *)
   &(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) =
       local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) =
       local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  *(double *)
   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
       local_188.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  puVar44 = (model->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1d0 = f_ext;
  local_1c8 = Tau;
  if (4 < (ulong)((long)(model->mJointUpdateOrder).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar44)) {
    uVar45 = 1;
    uVar51 = 2;
    do {
      jcalc(model,puVar44[uVar45],Q,QDot);
      puVar44 = (model->mJointUpdateOrder).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar21 = uVar51 < (ulong)((long)(model->mJointUpdateOrder).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar44 >>
                               2);
      uVar45 = uVar51;
      uVar51 = (ulong)((int)uVar51 + 1);
    } while (bVar21);
  }
  uVar45 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (1 < uVar45) {
    uVar51 = 1;
    uVar47 = 2;
    do {
      uVar45 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar51];
      if (uVar45 == 0) {
        pSVar15 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar16 = (model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar34 = *(double *)
                  ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(undefined8 *)
         &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(undefined8 *)
              &pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        *(double *)
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar34;
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar34 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar34;
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar34 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar34;
        Math::SpatialTransform::apply
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar51,&local_188);
        pSVar15 = (model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar1 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[4];
        pdVar1[1] = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[5];
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar1 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[2];
        pdVar1[1] = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[3];
        *(double *)
         &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        *(double *)
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
      }
      else {
        Math::SpatialTransform::apply
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar51,
                   (model->v).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar45);
        pSVar15 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar16 = (model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar34 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1] + *(double *)
                        ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        auVar22._8_4_ = SUB84(dVar34,0);
        auVar22._0_8_ =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
             + *(double *)
                &pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        auVar22._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar22;
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar34 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [3] + pdVar1[1];
        auVar23._8_4_ = SUB84(dVar34,0);
        auVar23._0_8_ =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
             + *pdVar1;
        auVar23._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar23;
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar34 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [5] + pdVar1[1];
        auVar24._8_4_ = SUB84(dVar34,0);
        auVar24._0_8_ =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4]
             + *pdVar1;
        auVar24._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar24;
        pSVar15 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar16 = (model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar34 = *(double *)
                  ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar6 = *(double *)
                 &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        dVar7 = *(double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar8 = *(double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
        dVar9 = *(double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar35 = *pdVar1;
        dVar36 = pdVar1[1];
        dVar10 = *(double *)
                  &pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        dVar11 = *(double *)
                  ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar37 = *pdVar1;
        dVar38 = pdVar1[1];
        dVar12 = *(double *)
                  ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
        pSVar15 = (model->c_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar16 = (model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar13 = *(double *)
                  ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             dVar35 * -dVar34 + dVar7 * dVar36 +
             *(double *)
              &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        *(double *)
         ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar10 * dVar34 + -dVar6 * dVar36 + dVar13;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar13 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar2 = dVar10 * -dVar7 + dVar35 * dVar6 + *pdVar1;
        pdVar2[1] = dVar38 * dVar7 + ((dVar36 * dVar9 - dVar8 * dVar35) - dVar34 * dVar37) + dVar13;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar7 = dVar6 * dVar37 + dVar12 * -dVar7 + dVar10 * -dVar9 + dVar11 * dVar35 + pdVar1[1];
        auVar25._8_4_ = SUB84(dVar7,0);
        auVar25._0_8_ =
             -dVar6 * dVar38 + dVar12 * dVar34 + dVar10 * dVar8 + -dVar11 * dVar36 + *pdVar1;
        auVar25._12_4_ = (int)((ulong)dVar7 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar25;
        Math::SpatialTransform::apply
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar51,
                   (model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar51]);
        pSVar15 = (model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar16 = (model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar34 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1] + *(double *)
                        ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        auVar26._8_4_ = SUB84(dVar34,0);
        auVar26._0_8_ =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
             + *(double *)
                &pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        auVar26._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar26;
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar34 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [3] + pdVar1[1];
        auVar27._8_4_ = SUB84(dVar34,0);
        auVar27._0_8_ =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
             + *pdVar1;
        auVar27._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar27;
        pdVar1 = (double *)
                 ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar34 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [5] + pdVar1[1];
        auVar28._8_4_ = SUB84(dVar34,0);
        auVar28._0_8_ =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4]
             + *pdVar1;
        auVar28._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar28;
      }
      if ((model->mBodies).
          super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
          super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar51].mIsVirtual == false) {
        Math::SpatialRigidBodyInertia::operator*
                  ((model->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar51,
                   (model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar51);
        pSVar15 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialRigidBodyInertia::operator*
                  ((model->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar51,pSVar15 + uVar51);
        dVar34 = *(double *)
                  ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar6 = *(double *)
                 &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        dVar7 = *(double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar8 = *(double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
        dVar9 = *(double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar10 = *(double *)
                  ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
        pSVar15 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *(double *)
         &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             dVar9 * dStack_190 +
             local_198 * -dVar8 + -dVar34 * (double)local_1b8.m_rhs + dVar7 * local_1a8 +
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        *(double *)
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             -dVar10 * dStack_190 +
             dStack_1a0 * dVar8 + dVar34 * (double)local_1b8.m_lhs.m_matrix + -dVar6 * local_1a8 +
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar1 = local_198 * dVar10 +
                  (((double)local_1b8.m_rhs * dVar6 - dVar7 * (double)local_1b8.m_lhs.m_matrix) -
                  dVar9 * dStack_1a0) +
                  local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[2];
        pdVar1[1] = local_198 * -dVar34 + dStack_190 * dVar7 +
                    local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[3];
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar1 = dStack_1a0 * dVar34 + -dVar6 * dStack_190 +
                  local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[4];
        pdVar1[1] = dStack_1a0 * -dVar7 + dVar6 * local_198 +
                    local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[5];
        if (local_1d0 != (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x0) {
          pSVar15 = (local_1d0->
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar34 = *(double *)
                    &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          if ((dVar34 == 0.0) && (!NAN(dVar34))) {
            dVar34 = *(double *)
                      ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            if (((dVar34 == 0.0) &&
                ((((!NAN(dVar34) &&
                   (dVar34 = *(double *)
                              ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                              0x10), dVar34 == 0.0)) && (!NAN(dVar34))) &&
                 ((dVar34 = *(double *)
                             ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                             0x18), dVar34 == 0.0 && (!NAN(dVar34))))))) &&
               ((dVar34 = *(double *)
                           ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                           0x20), dVar34 == 0.0 &&
                (((!NAN(dVar34) &&
                  (dVar34 = *(double *)
                             ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                             0x28), dVar34 == 0.0)) && (!NAN(dVar34))))))) goto LAB_0017028b;
          }
          Math::SpatialTransform::toMatrixAdjoint
                    (&local_158,
                     (model->X_base).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar51);
          pSVar15 = (local_1d0->
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar16 = (model->f).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar6 = *(double *)
                   &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          dVar7 = *(double *)
                   ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar8 = *(double *)
                   ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar9 = *(double *)
                   ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
          pdVar1 = (double *)
                   ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar10 = *pdVar1;
          dVar11 = pdVar1[1];
          dVar34 = *(double *)
                    ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) -
                   (local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0x1f] * dVar11 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x19] * dVar10 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x13] * dVar9 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xd] * dVar8 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[7] * dVar7 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1] * dVar6);
          auVar32._8_4_ = SUB84(dVar34,0);
          auVar32._0_8_ =
               *(double *)
                &pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> -
               (local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0x1e] * dVar11 +
               local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x18] * dVar10 +
               local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0x12] * dVar9 +
               local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0xc] * dVar8 +
               local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [6] * dVar7 +
               local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0] * dVar6);
          auVar32._12_4_ = (int)((ulong)dVar34 >> 0x20);
          *(undefined1 (*) [16])
           &pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar32;
          pdVar1 = (double *)
                   ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar34 = pdVar1[1] -
                   (local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0x21] * dVar11 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1b] * dVar10 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x15] * dVar9 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xf] * dVar8 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[9] * dVar7 +
                   local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[3] * dVar6);
          pdVar2 = (double *)
                   ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar12 = *pdVar2;
          dVar13 = pdVar2[1];
          auVar33._8_4_ = SUB84(dVar34,0);
          auVar33._0_8_ =
               *pdVar1 - (local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x20] * dVar11 +
                         local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0x1a] * dVar10 +
                         local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0x14] * dVar9 +
                         local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0xe] * dVar8 +
                         local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[8] * dVar7 +
                         local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[2] * dVar6);
          auVar33._12_4_ = (int)((ulong)dVar34 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar33;
          pdVar1 = (double *)
                   ((long)&pSVar16[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          *pdVar1 = dVar12 - (dVar11 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[0x22] +
                             dVar10 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x1c] +
                             dVar9 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[0x16] +
                             dVar8 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[0x10] +
                             dVar7 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[10] +
                             dVar6 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[4]);
          pdVar1[1] = dVar13 - (dVar11 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                         .m_storage.m_data.array[0x23] +
                               dVar10 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                        .m_storage.m_data.array[0x1d] +
                               dVar9 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[0x17] +
                               dVar8 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[0x11] +
                               dVar7 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[0xb] +
                               dVar6 * local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[5]);
        }
      }
      else {
        pSVar15 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar1 = 0.0;
        pdVar1[1] = 0.0;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar1 = 0.0;
        pdVar1[1] = 0.0;
        *(undefined8 *)
         &pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
        *(double *)
         ((long)&pSVar15[uVar51].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      }
LAB_0017028b:
      uVar51 = (ulong)uVar47;
      uVar45 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar47 = uVar47 + 1;
    } while (uVar51 <= uVar45 && uVar45 - uVar51 != 0);
  }
  uVar47 = (int)uVar45 - 1;
  if (uVar47 != 0) {
    uVar45 = (ulong)uVar47;
    lVar48 = uVar45 * 0xc + 8;
    lVar49 = uVar45 * 0x30;
    pvVar52 = (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)(uVar45 * 0x24 + 0x20);
    lVar50 = uVar45 * 0x60;
    do {
      uVar51 = uVar45 - 1;
      pJVar17 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)pJVar17 + lVar48 * 2 + -8) == 0x14) {
        uVar47 = *(uint *)((long)&pJVar17->mJointAxes + lVar48 * 2 + 4);
        ppCVar18 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_1b8.m_lhs.m_matrix = (non_const_type)(ppCVar18[uVar47] + 0x70);
        local_1b8.m_rhs =
             (RhsNested)
             ((long)&(((model->f).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar49);
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
             (double)(ulong)*(uint *)((long)&pJVar17->mJointAxes + lVar48 * 2);
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)(ulong)*(uint *)(ppCVar18[uVar47] + 8);
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((local_1c8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data +
                     (long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[4]);
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
             (double)(local_1c8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             4.94065645841247e-324;
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
             (double)local_1c8;
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0
        ;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)&local_158,
                   &local_1b8,&local_1d1,(type)0x0);
      }
      else {
        iVar14 = *(int *)((long)pJVar17 + lVar48 * 2 + -4);
        if (iVar14 == 3) {
          pMVar19 = (model->multdof3_S).
                    super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar15 = (model->f).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar46 = (ulong)*(uint *)((long)&pJVar17->mJointAxes + lVar48 * 2);
          pdVar20 = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          pdVar1 = (double *)
                   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar49);
          dVar34 = *pdVar1;
          dVar6 = pdVar1[1];
          pdVar1 = (double *)
                   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar49 + 0x10);
          dVar7 = *pdVar1;
          dVar8 = pdVar1[1];
          pdVar1 = (double *)
                   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar49 + 0x20);
          dVar9 = *pdVar1;
          dVar10 = pdVar1[1];
          pdVar2 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x80);
          pdVar3 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x70);
          pdVar4 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x60);
          pdVar1 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x50);
          dVar11 = *pdVar1;
          dVar12 = pdVar1[1];
          pdVar1 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x40);
          dVar13 = *pdVar1;
          dVar35 = pdVar1[1];
          pdVar1 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x30);
          dVar36 = *pdVar1;
          dVar37 = pdVar1[1];
          pdVar1 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x20);
          dVar38 = *pdVar1;
          dVar39 = pdVar1[1];
          pdVar1 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4 + -0x10);
          dVar40 = *pdVar1;
          dVar41 = pdVar1[1];
          pdVar1 = (double *)
                   ((long)&(pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + (long)pvVar52 * 4);
          dVar42 = *pdVar1;
          dVar43 = pdVar1[1];
          pdVar1 = pdVar20 + uVar46;
          *pdVar1 = pdVar4[1] * dVar10 + pdVar3[1] * dVar8 + pdVar2[1] * dVar6 +
                    *pdVar4 * dVar9 + *pdVar3 * dVar7 + *pdVar2 * dVar34;
          pdVar1[1] = dVar37 * dVar10 + dVar35 * dVar8 + dVar12 * dVar6 +
                      dVar36 * dVar9 + dVar13 * dVar7 + dVar11 * dVar34;
          pdVar20[uVar46 + 2] =
               dVar10 * dVar43 + dVar8 * dVar41 + dVar6 * dVar39 +
               dVar9 * dVar42 + dVar7 * dVar40 + dVar34 * dVar38;
        }
        else if (iVar14 == 1) {
          pSVar15 = (model->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar16 = (model->f).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (double *)
                   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar49);
          pdVar3 = (double *)
                   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar49 + 0x10);
          pdVar4 = (double *)
                   ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar49 + 0x20);
          pdVar2 = (double *)
                   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar49);
          pdVar20 = (double *)
                    ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                    lVar49 + 0x10);
          pdVar5 = (double *)
                   ((long)&(pSVar16->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar49 + 0x20);
          (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_data[*(uint *)((long)&pJVar17->mJointAxes + lVar48 * 2)] =
               pdVar4[1] * pdVar5[1] + pdVar3[1] * pdVar20[1] + pdVar1[1] * pdVar2[1] +
               *pdVar4 * *pdVar5 + *pdVar3 * *pdVar20 + *pdVar1 * *pdVar2;
        }
      }
      uVar46 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar45];
      if (uVar46 != 0) {
        pSVar15 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_1d0 = pvVar52;
        local_1c0 = lVar48;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar50)
                   ,(SpatialVector *)
                    ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar49));
        uVar47 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar45];
        pSVar16 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar34 = *(double *)
                  ((long)&pSVar15[uVar46].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                 local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1];
        auVar29._8_4_ = SUB84(dVar34,0);
        auVar29._0_8_ =
             *(double *)
              &pSVar15[uVar46].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        auVar29._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar16[uVar47].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar29;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar46].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar34 = pdVar1[1] +
                 local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [3];
        auVar30._8_4_ = SUB84(dVar34,0);
        auVar30._0_8_ =
             *pdVar1 + local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[2];
        auVar30._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar16[uVar47].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar30;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar46].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar34 = pdVar1[1] +
                 local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [5];
        auVar31._8_4_ = SUB84(dVar34,0);
        auVar31._0_8_ =
             *pdVar1 + local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[4];
        auVar31._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar16[uVar47].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar31;
        lVar48 = local_1c0;
        pvVar52 = local_1d0;
      }
      lVar48 = lVar48 + -0xc;
      lVar49 = lVar49 + -0x30;
      pvVar52 = (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)
                ((long)&pvVar52[-2].
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4);
      lVar50 = lVar50 + -0x60;
      uVar45 = uVar51;
    } while ((int)uVar51 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void NonlinearEffects ( 
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    VectorNd &Tau,
    std::vector<Math::SpatialVector> *f_ext) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  SpatialVector spatial_gravity (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0] = spatial_gravity;

  for (unsigned int i = 1; i < model.mJointUpdateOrder.size(); i++) {
    jcalc (model, model.mJointUpdateOrder[i], Q, QDot);
  }

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (model.lambda[i] == 0) {
      model.v[i] = model.v_J[i];
      model.a[i] = model.X_lambda[i].apply(spatial_gravity);
    }	else {
      model.v[i] = model.X_lambda[i].apply(model.v[model.lambda[i]]) + model.v_J[i];
      model.c[i] = model.c_J[i] + crossm(model.v[i],model.v_J[i]);
      model.a[i] = model.X_lambda[i].apply(model.a[model.lambda[i]]) + model.c[i];
    }

    if (!model.mBodies[i].mIsVirtual) {
      model.f[i] = model.I[i] * model.a[i] + crossf(model.v[i],model.I[i] * model.v[i]);
#ifdef RBDL_USE_CASADI_MATH
      if (f_ext != NULL)
#else
      if (f_ext != NULL && (*f_ext)[i] != SpatialVector::Zero())
#endif
      {
        model.f[i] -= model.X_base[i].toMatrixAdjoint() * (*f_ext)[i];
      }            
    } else {
      model.f[i].setZero();
    }
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if(model.mJoints[i].mJointType != JointTypeCustom){
      if (model.mJoints[i].mDoFCount == 1) {
        Tau[model.mJoints[i].q_index]
          = model.S[i].dot(model.f[i]);
      } else if (model.mJoints[i].mDoFCount == 3) {
        Tau.block<3,1>(model.mJoints[i].q_index, 0)
          = model.multdof3_S[i].transpose() * model.f[i];
      }
    } else if(model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int k = model.mJoints[i].custom_joint_index;
      Tau.block(model.mJoints[i].q_index,0,
          model.mCustomJoints[k]->mDoFCount, 1)
        = model.mCustomJoints[k]->S.transpose() * model.f[i];
    }

    if (model.lambda[i] != 0) {
      model.f[model.lambda[i]] = model.f[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.f[i]);
    }
  }
}